

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_vertex.cxx
# Opt level: O3

void __thiscall Fl_Graphics_Driver::fixloop(Fl_Graphics_Driver *this)

{
  short sVar1;
  XPoint *pXVar2;
  bool bVar3;
  uint uVar4;
  
  if (2 < this->n) {
    pXVar2 = this->p;
    sVar1 = pXVar2->x;
    uVar4 = this->n;
    do {
      if (pXVar2[(ulong)uVar4 - 1].x != sVar1) {
        return;
      }
      if (pXVar2[(ulong)uVar4 - 1].y != pXVar2->y) {
        return;
      }
      this->n = uVar4 - 1;
      bVar3 = 3 < (int)uVar4;
      uVar4 = uVar4 - 1;
    } while (bVar3);
  }
  return;
}

Assistant:

void Fl_Graphics_Driver::fixloop() {  // remove equal points from closed path
  while (n>2 && p[n-1].x == p[0].x && p[n-1].y == p[0].y) n--;
}